

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::While_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(While_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this,
             Dispatch_State *t_ss)

{
  bool bVar1;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  Scope_Push_Pop spp;
  Scope_Push_Pop local_48;
  undefined1 local_40 [16];
  
  chaiscript::detail::Dispatch_Engine::new_scope((in_RDX->m_stack_holder)._M_data);
  while( true ) {
    bVar1 = AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
            get_scoped_bool_condition
                      ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                        *)((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock
                          .__align,in_RDX);
    if (!bVar1) break;
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               local_40,*(Dispatch_State **)
                         ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                                 _M_rwlock + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  }
  void_var();
  detail::Scope_Push_Pop::~Scope_Push_Pop(&local_48);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        try {
          while (this->get_scoped_bool_condition(*this->children[0], t_ss)) {
            try {
              this->children[1]->eval(t_ss);
            } catch (detail::Continue_Loop &) {
              // we got a continue exception, which means all of the remaining
              // loop implementation is skipped and we just need to continue to
              // the next condition test
            }
          }
        } catch (detail::Break_Loop &) {
          // loop was broken intentionally
        }

        return void_var();
      }